

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Server_processBinaryMessage
               (UA_Server *server,UA_Connection *connection,UA_ByteString *message)

{
  UA_SecureChannel *channel_00;
  UA_Logger logger;
  UA_StatusCode code;
  uint uVar1;
  char *pcVar2;
  uint local_64;
  undefined1 local_58 [8];
  UA_ByteString offsetMessage;
  UA_UInt32 channelId;
  UA_StatusCode retval_1;
  UA_TcpMessageHeader tcpMessageHeader;
  size_t offset;
  UA_StatusCode retval;
  UA_SecureChannel *channel;
  UA_ByteString *message_local;
  UA_Connection *connection_local;
  UA_Server *server_local;
  
  channel_00 = connection->channel;
  if (channel_00 == (UA_SecureChannel *)0x0) {
    tcpMessageHeader.messageTypeAndChunkType = 0;
    tcpMessageHeader.messageSize = 0;
    offsetMessage.data._4_4_ =
         UA_TcpMessageHeader_decodeBinary
                   (message,(size_t *)&tcpMessageHeader,(UA_TcpMessageHeader *)&channelId);
    if (offsetMessage.data._4_4_ == 0) {
      uVar1 = channelId & 0xffffff;
      if (uVar1 == 0x47534d) {
        UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_NETWORK,
                     "Connection %i | Processing a MSG message not possible without a SecureChannel"
                     ,(ulong)(uint)connection->sockfd);
        (*connection->close)(connection);
      }
      else if (uVar1 == 0x4c4548) {
        UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_NETWORK,
                     "Connection %i | Process HEL message",(ulong)(uint)connection->sockfd);
        processHEL(connection,message,(size_t *)&tcpMessageHeader);
      }
      else if (uVar1 == 0x4e504f) {
        UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_NETWORK,
                     "Connection %i | Process OPN message",(ulong)(uint)connection->sockfd);
        offsetMessage.data._0_4_ = 0;
        offsetMessage.data._4_4_ =
             UA_UInt32_decodeBinary
                       (message,(size_t *)&tcpMessageHeader,(UA_UInt32 *)&offsetMessage.data);
        if (offsetMessage.data._4_4_ != 0) {
          (*connection->close)(connection);
        }
        local_58 = (undefined1  [8])(message->length - 0xc);
        offsetMessage.length = (size_t)(message->data + 0xc);
        processOPN(server,connection,(UA_UInt32)offsetMessage.data,(UA_ByteString *)local_58);
      }
      else if (uVar1 == 0x4f4c43) {
        UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_NETWORK,
                     "Connection %i | Processing a CLO message not possible without a SecureChannel"
                     ,(ulong)(uint)connection->sockfd);
        (*connection->close)(connection);
      }
      else if (uVar1 == 0x525245) {
        UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_NETWORK,
                     "Connection %i | Process ERR message",(ulong)(uint)connection->sockfd);
        processERR(server,connection,message,(size_t *)&tcpMessageHeader);
      }
      else {
        UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_NETWORK,
                     "Connection %i | Unknown message type",(ulong)(uint)connection->sockfd);
        (*connection->close)(connection);
      }
    }
    else {
      (*connection->close)(connection);
    }
  }
  else {
    code = UA_SecureChannel_processChunks
                     (channel_00,message,UA_Server_processSecureChannelMessage,server);
    if (code != 0) {
      logger = (server->config).logger;
      if (channel_00->connection == (UA_Connection *)0x0) {
        local_64 = 0;
      }
      else {
        local_64 = channel_00->connection->sockfd;
      }
      uVar1 = (channel_00->securityToken).channelId;
      pcVar2 = UA_StatusCode_name(code);
      UA_LOG_TRACE(logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Procesing chunks resulted in error code %s",
                   (ulong)local_64,(ulong)uVar1,pcVar2);
    }
  }
  return;
}

Assistant:

void
UA_Server_processBinaryMessage(UA_Server *server, UA_Connection *connection,
                               const UA_ByteString *message) {
    UA_SecureChannel *channel = connection->channel;
    if(channel) {
        /* Assemble chunks in the securechannel and process complete messages */
        UA_StatusCode retval = 
            UA_SecureChannel_processChunks(channel, message,
                 (UA_ProcessMessageCallback*)UA_Server_processSecureChannelMessage, server);
        if(retval != UA_STATUSCODE_GOOD)
            UA_LOG_TRACE_CHANNEL(server->config.logger, channel, "Procesing chunks "
                                 "resulted in error code %s", UA_StatusCode_name(retval));
    } else {
        /* Process messages without a channel and no chunking */
        size_t offset = 0;
        UA_TcpMessageHeader tcpMessageHeader;
        UA_StatusCode retval = UA_TcpMessageHeader_decodeBinary(message, &offset, &tcpMessageHeader);
        if(retval != UA_STATUSCODE_GOOD) {
            connection->close(connection);
            return;
        }

        /* Dispatch according to the message type */
        switch(tcpMessageHeader.messageTypeAndChunkType & 0x00ffffff) {
        case UA_MESSAGETYPE_ERR:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process ERR message", connection->sockfd);
            processERR(server, connection, message, &offset);
            break;
        case UA_MESSAGETYPE_HEL:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process HEL message", connection->sockfd);
            processHEL(connection, message, &offset);
            break;
        case UA_MESSAGETYPE_OPN: {
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Process OPN message", connection->sockfd);
            UA_UInt32 channelId = 0;
            retval = UA_UInt32_decodeBinary(message, &offset, &channelId);
            if(retval != UA_STATUSCODE_GOOD)
                connection->close(connection);
            UA_ByteString offsetMessage = (UA_ByteString){
                .data = message->data + 12, .length = message->length - 12};
            processOPN(server, connection, channelId, &offsetMessage);
            break; }
        case UA_MESSAGETYPE_MSG:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Processing a MSG message not possible "
                         "without a SecureChannel", connection->sockfd);
            connection->close(connection);
            break;
        case UA_MESSAGETYPE_CLO:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Processing a CLO message not possible "
                         "without a SecureChannel", connection->sockfd);
            connection->close(connection);
            break;
        default:
            UA_LOG_TRACE(server->config.logger, UA_LOGCATEGORY_NETWORK,
                         "Connection %i | Unknown message type", connection->sockfd);
            connection->close(connection);
        }
    }
}